

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_code.c
# Opt level: O0

void ReplaceReservedXmlCharacters(char *input,char *output)

{
  size_t sVar1;
  char *in_RSI;
  char *in_RDI;
  char tempString [8192];
  char *currentPosition;
  char local_2018 [8192];
  char *local_18;
  char *local_10;
  
  if ((in_RDI != (char *)0x0) && (in_RSI != (char *)0x0)) {
    local_10 = in_RSI;
    strcpy(in_RSI,in_RDI);
    local_18 = local_10;
    while (local_18 = strchr(local_18,0x26), local_18 != (char *)0x0) {
      local_2018[0] = '\0';
      sVar1 = strlen(local_18);
      if (1 < sVar1) {
        strcpy(local_2018,local_18 + 1);
      }
      sprintf(local_18,"&amp;%s",local_2018);
    }
    local_18 = local_10;
    while (local_18 = strchr(local_18,0x3c), local_18 != (char *)0x0) {
      local_2018[0] = '\0';
      sVar1 = strlen(local_18);
      if (1 < sVar1) {
        strcpy(local_2018,local_18 + 1);
      }
      sprintf(local_18,"&lt;%s",local_2018);
    }
    local_18 = local_10;
    while (local_18 = strchr(local_18,0x3e), local_18 != (char *)0x0) {
      local_2018[0] = '\0';
      sVar1 = strlen(local_18);
      if (1 < sVar1) {
        strcpy(local_2018,local_18 + 1);
      }
      sprintf(local_18,"&gt;%s",local_2018);
    }
    local_18 = local_10;
    while (local_18 = strchr(local_18,0x27), local_18 != (char *)0x0) {
      local_2018[0] = '\0';
      sVar1 = strlen(local_18);
      if (1 < sVar1) {
        strcpy(local_2018,local_18 + 1);
      }
      sprintf(local_18,"&apos;%s",local_2018);
    }
    local_18 = local_10;
    while (local_18 = strchr(local_18,0x22), local_18 != (char *)0x0) {
      local_2018[0] = '\0';
      sVar1 = strlen(local_18);
      if (1 < sVar1) {
        strcpy(local_2018,local_18 + 1);
      }
      sprintf(local_18,"&quot;%s",local_2018);
    }
  }
  return;
}

Assistant:

static void ReplaceReservedXmlCharacters(const char *input, char *output )
{
	char *currentPosition;
	char tempString[8*1024];

	if((input == NULL) || (output == NULL))
	{
		return;
	}

	strcpy(output, input);

	/*Replace '&' with "&amp;"
	 *Note1: '&' has to be processed first as otherwise we replace the
	 *       '&' in the escaped characters.
	 *Note2: We assume that the input string does not have any escaped
	 *       characters already.
     */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '&')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&amp;%s", tempString);
	}

	/* Replace '<' with "&lt;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '<')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&lt;%s", tempString);
	}

	/* Replace '>' with "&gt;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '>')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&gt;%s", tempString);
	}

    /* Replace ''' with "&apos;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '\'')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&apos;%s", tempString);
	}

	/* Replace '"' with "&quot;" */
	currentPosition = output;
	while((currentPosition = strchr(currentPosition, '"')) != NULL)
	{
		tempString[0] = '\0';
		if(strlen(currentPosition) > 1)
		{
			strcpy(tempString, currentPosition+1);
		}
		sprintf(currentPosition, "&quot;%s", tempString);
	}
}